

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm_vecsmall::SmallVectorImpl<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>_>
::~SmallVectorImpl(SmallVectorImpl<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>_>
                   *this)

{
  undefined1 *__ptr;
  
  __ptr = (undefined1 *)
          (this->
          super_SmallVectorTemplateBase<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>,_false>
          ).
          super_SmallVectorTemplateCommon<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>,_void>
          .super_SmallVectorBase.BeginX;
  if ((U *)__ptr ==
      &(this->
       super_SmallVectorTemplateBase<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>,_false>
       ).
       super_SmallVectorTemplateCommon<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>,_void>
       .FirstEl) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      free(this->begin());
  }